

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahrens_beylkin.hpp
# Opt level: O3

int64_t IntegratorXX::quadrature_traits<IntegratorXX::AhrensBeylkin<double>,_void>::
        npts_by_algebraic_order(int64_t order)

{
  switch(order) {
  case 0xe:
    return 0x48;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1e:
  case 0x1f:
  case 0x21:
  case 0x22:
  case 0x24:
  case 0x26:
  case 0x28:
  case 0x2a:
  case 0x2b:
  case 0x2e:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x34:
  case 0x37:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3d:
  case 0x40:
  case 0x41:
  case 0x44:
  case 0x47:
  case 0x49:
  case 0x4a:
  case 0x4d:
  case 0x52:
  case 0x53:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x5c:
  case 0x5d:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x66:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x72:
  case 0x73:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x7a:
  case 0x7b:
  case 0x7d:
  case 0x7e:
  case 0x81:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
    goto switchD_0019be24_caseD_f;
  case 0x13:
    return 0x84;
  case 0x17:
    return 0xc0;
  case 0x1d:
    return 0x138;
  case 0x20:
    return 0x174;
  case 0x23:
    return 0x1b0;
  case 0x25:
    return 0x1ec;
  case 0x27:
    return 0x228;
  case 0x29:
    return 0x264;
  case 0x2c:
    return 0x2a0;
  case 0x2d:
    return 0x2dc;
  case 0x2f:
    return 0x318;
  case 0x33:
    return 0x390;
  case 0x35:
    return 0x3cc;
  case 0x36:
    return 0x408;
  case 0x38:
    return 0x444;
  case 0x3c:
    return 0x4f8;
  case 0x3e:
    return 0x534;
  case 0x3f:
    return 0x570;
  case 0x42:
    return 0x5e8;
  case 0x43:
    return 0x624;
  case 0x45:
    return 0x660;
  case 0x46:
    return 0x69c;
  case 0x48:
    return 0x714;
  case 0x4b:
    return 0x78c;
  case 0x4c:
    return 0x7c8;
  case 0x4e:
    return 0x840;
  case 0x4f:
    return 0x87c;
  case 0x50:
    return 0x8b8;
  case 0x51:
    return 0x8f4;
  case 0x54:
    return 0x96c;
  case 0x55:
    return 0x9a8;
  case 0x59:
    return 0xa98;
  case 0x5a:
    return 0xad4;
  case 0x5b:
    return 0xb10;
  case 0x5e:
    return 0xbc4;
  case 0x62:
    return 0xcf0;
  case 99:
    return 0xd2c;
  case 100:
    return 0xd68;
  case 0x65:
    return 0xda4;
  case 0x67:
    return 0xe1c;
  case 0x69:
    return 0xed0;
  case 0x6f:
    return 0x1074;
  case 0x71:
    return 0x10ec;
  case 0x74:
    return 0x11dc;
  case 0x75:
    return 0x1254;
  case 0x79:
    return 0x1380;
  case 0x7c:
    return 0x1470;
  case 0x7f:
    return 0x1560;
  case 0x80:
    return 0x15d8;
  case 0x82:
    return 0x168c;
  case 0x87:
    return 0x1830;
  case 0x88:
    return 0x18a8;
  case 0x8f:
    return 0x1b00;
  case 0x95:
    return 0x1d58;
  default:
    if (order == 0xd2) {
      return 0x3aa4;
    }
switchD_0019be24_caseD_f:
    return -1;
  }
}

Assistant:

inline static int64_t npts_by_algebraic_order(int64_t order) {
  switch (order) {
  case 14:
    return 72;
  case 19:
    return 132;
  case 23:
    return 192;
  case 29:
    return 312;
  case 32:
    return 372;
  case 35:
    return 432;
  case 37:
    return 492;
  case 39:
    return 552;
  case 41:
    return 612;
  case 44:
    return 672;
  case 45:
    return 732;
  case 47:
    return 792;
  case 51:
    return 912;
  case 53:
    return 972;
  case 54:
    return 1032;
  case 56:
    return 1092;
  case 60:
    return 1272;
  case 62:
    return 1332;
  case 63:
    return 1392;
  case 66:
    return 1512;
  case 67:
    return 1572;
  case 69:
    return 1632;
  case 70:
    return 1692;
  case 72:
    return 1812;
  case 75:
    return 1932;
  case 76:
    return 1992;
  case 78:
    return 2112;
  case 79:
    return 2172;
  case 80:
    return 2232;
  case 81:
    return 2292;
  case 84:
    return 2412;
  case 85:
    return 2472;
  case 89:
    return 2712;
  case 90:
    return 2772;
  case 91:
    return 2832;
  case 94:
    return 3012;
  case 98:
    return 3312;
  case 99:
    return 3372;
  case 100:
    return 3432;
  case 101:
    return 3492;
  case 103:
    return 3612;
  case 105:
    return 3792;
  case 111:
    return 4212;
  case 113:
    return 4332;
  case 116:
    return 4572;
  case 117:
    return 4692;
  case 121:
    return 4992;
  case 124:
    return 5232;
  case 127:
    return 5472;
  case 128:
    return 5592;
  case 130:
    return 5772;
  case 135:
    return 6192;
  case 136:
    return 6312;
  case 143:
    return 6912;
  case 149:
    return 7512;
  case 210:
    return 15012;
  default:
    return -1;
  }
}